

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compaction.cpp
# Opt level: O2

int main(void)

{
  uint uVar1;
  int iVar2;
  ostream *poVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  int i;
  uint64_t key;
  string path;
  string value;
  char *local_4ef0 [4];
  KVStore store;
  random_device rd;
  mt19937 mt;
  
  std::__cxx11::string::string((string *)&path,"../data",(allocator *)&store);
  std::chrono::_V2::system_clock::now();
  poVar3 = std::operator<<((ostream *)&std::cout,">>>>> Compaction Test <<<<<");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::random_device::random_device(&rd);
  uVar1 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&mt,(ulong)uVar1);
  std::__cxx11::string::string((string *)local_4ef0,(string *)&path);
  iVar2 = stat(local_4ef0[0],(stat *)&store);
  std::__cxx11::string::~string((string *)local_4ef0);
  if ((iVar2 == 0) && ((store.storagePath.field_2._M_allocated_capacity._0_4_ & 0x4000) != 0)) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&store,
                   "rm -rf ",&path);
    system((char *)store.super_KVStoreAPI._vptr_KVStoreAPI);
    std::__cxx11::string::~string((string *)&store);
  }
  KVStore::KVStore(&store,&path);
  value._M_dataplus._M_p = (pointer)&value.field_2;
  std::__cxx11::string::_M_construct((ulong)&value,-0x80);
  uVar7 = 0;
  iVar6 = 0;
  iVar2 = 0;
  for (key = 0; key != 50000; key = key + 1) {
    lVar4 = std::chrono::_V2::system_clock::now();
    KVStore::put(&store,key,&value);
    lVar5 = std::chrono::_V2::system_clock::now();
    uVar7 = uVar7 + (lVar5 - lVar4) / 1000;
    if ((ulong)(long)iVar6 < uVar7 / 1000000) {
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)key - iVar2);
      std::endl<char,std::char_traits<char>>(poVar3);
      iVar6 = iVar6 + 1;
      iVar2 = (int)key;
    }
  }
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,10);
  std::operator<<(poVar3," puts per compaction, Delay: ");
  poVar3 = std::ostream::_M_insert<double>((double)(uVar7 / 1000000) / 1000.0);
  poVar3 = std::operator<<(poVar3,"ms");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::chrono::_V2::system_clock::now();
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar3 = std::operator<<((ostream *)&std::cout,">>>>> Summary <<<<<");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"It takes ");
  poVar3 = std::ostream::_M_insert<long>((long)poVar3);
  poVar3 = std::operator<<(poVar3,"s to complete the test.");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string((string *)&value);
  KVStore::~KVStore(&store);
  std::random_device::~random_device(&rd);
  std::__cxx11::string::~string((string *)&path);
  return 0;
}

Assistant:

int main() {
  string path = "../data";

  auto start = high_resolution_clock::now();
  cout << ">>>>> Compaction Test <<<<<" << endl;

  random_device rd;
  mt19937 mt(rd());

  int remain = 2 * 1024 * 1024 - 32 - 10240 - 1000 * 12;

  auto f = 10;

  if (utils::dirExists(path)) {
    string cmd = "rm -rf " + path;
    system(cmd.c_str());
  }
  KVStore store(path);
  string value(remain / f, 's');

  unsigned long long mis = 0;
  int sec = 0;
  int ii = 0;
  for (int i = 0; i < f * 5000; i++) {
    auto s = high_resolution_clock::now();
    store.put(i, value);
    auto e = high_resolution_clock::now();
    mis += duration_cast<microseconds>(e - s).count();
    if (mis / 1000 / 1000 > sec) {
      cout << i - ii << endl;
      ii = i;
      sec++;
    }
  }
  cout << f << " puts per compaction, Delay: "
       << mis / 1000 / 1000 / (double)(f * 100) << "ms" << endl;

  // cout << "no compaction, ";
  // µs = 0;
  // KVStore store2(path);
  // for (int i = 0; i < 200000; i++) {
  //   auto key = mt();
  //   auto s = high_resolution_clock::now();
  //   store2.put(key, "s");
  //   auto e = high_resolution_clock::now();
  //   µs += duration_cast<nanoseconds>(e - s).count();
  // }
  // cout << "Delay: " << µs / 1000 / 1000 / (double)(200000) << "ms" << endl;

  auto end = high_resolution_clock::now();
  auto totalTime = duration_cast<seconds>(end - start).count();

  cout << endl;
  cout << ">>>>> Summary <<<<<" << endl;
  cout << "It takes " << totalTime << "s to complete the test." << endl;
}